

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper.cpp
# Opt level: O3

ostream * pstore::operator<<(ostream *os,memory_mapper_base *mm)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ offset: ",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", size: ",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," }",2);
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & os, memory_mapper_base const & mm) {
        return os << "{ offset: " << mm.offset () << ", size: " << mm.size () << " }";
    }